

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O0

void __thiscall Selector::removeListener(Selector *this,int fd,SelectorListener *listener)

{
  bool bVar1;
  ListenerNode **ppLVar2;
  iterator local_78;
  undefined1 local_70 [16];
  iterator i;
  bool update;
  undefined1 local_50 [8];
  ListenerNode n;
  AutoLock l;
  SelectorListener *listener_local;
  int fd_local;
  Selector *this_local;
  
  AutoLock::AutoLock((AutoLock *)&n.mPrivateData,&this->mLock);
  ListenerNode::ListenerNode((ListenerNode *)local_50,fd,(SelectorListener *)0x0);
  i.mNode._3_1_ = 0;
  JetHead::list<Selector::ListenerNode_*>::begin((list<Selector::ListenerNode_*> *)(local_70 + 8));
  while( true ) {
    JetHead::list<Selector::ListenerNode_*>::end((list<Selector::ListenerNode_*> *)local_70);
    bVar1 = JetHead::list<Selector::ListenerNode_*>::iterator::operator!=
                      ((iterator *)(local_70 + 8),(iterator *)local_70);
    JetHead::list<Selector::ListenerNode_*>::iterator::~iterator((iterator *)local_70);
    if (!bVar1) break;
    ppLVar2 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*
                        ((iterator *)(local_70 + 8));
    bVar1 = ListenerNode::operator==(*ppLVar2,(ListenerNode *)local_50);
    if (bVar1) {
      i.mNode._3_1_ = 1;
      ppLVar2 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*
                          ((iterator *)(local_70 + 8));
      if (*ppLVar2 != (ListenerNode *)0x0) {
        operator_delete(*ppLVar2,0x18);
      }
      JetHead::list<Selector::ListenerNode_*>::iterator::erase(&local_78);
      local_70._8_8_ = local_78.mNode;
      JetHead::list<Selector::ListenerNode_*>::iterator::~iterator(&local_78);
    }
    else {
      JetHead::list<Selector::ListenerNode_*>::iterator::operator++((iterator *)(local_70 + 8));
    }
  }
  if ((i.mNode._3_1_ & 1) != 0) {
    updateListeners(this);
  }
  JetHead::list<Selector::ListenerNode_*>::iterator::~iterator((iterator *)(local_70 + 8));
  AutoLock::~AutoLock((AutoLock *)&n.mPrivateData);
  return;
}

Assistant:

void Selector::removeListener( int fd, SelectorListener *listener )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	AutoLock l( mLock );
	ListenerNode n( fd, NULL );
	bool update = false;
	
	JetHead::list<ListenerNode*>::iterator i = mList.begin(); 
	while (i != mList.end())
	{
		if (*(*i) == n)
		{
			update = true;
			delete *i;
			i = i.erase();
		} 
		else 
		{
			++i;
		}
	}
		
	if ( update )
	{
		updateListeners();		
	}
}